

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O0

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<11U,_unsigned_int,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_R8;
  uint in_R9D;
  uint32_t in_2;
  uint32_t bucket_5;
  uint32_t in_1;
  uint32_t bucket_4;
  uint32_t in;
  uint32_t bucket_3;
  uint32_t out;
  uint *values [2];
  uint *keys [2];
  uint32_t bucket_2;
  uint32_t i_1;
  uint32_t tsum;
  uint32_t bucket_1;
  uint32_t sum [3];
  uint32_t pos;
  uint32_t shift;
  uint32_t bucket;
  uint key;
  uint32_t i;
  uint32_t hist [3] [2048];
  PassThrough pass_through;
  PassThrough encode_op;
  PassThrough decode_op;
  uint local_609c;
  long local_6088 [4];
  uint local_6068;
  uint local_6064;
  int local_6060;
  uint local_605c;
  int aiStack_6058 [4];
  int local_6048;
  uint local_6044;
  uint local_6040;
  uint local_603c;
  int local_6038 [4096];
  undefined1 auStack_2038 [8203];
  PassThrough local_2d;
  uint local_2c;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_6038,0,0x6000);
  for (local_603c = 0; local_603c < local_2c; local_603c = local_603c + 1) {
    local_6040 = PassThrough::operator()(&local_2d,*(uint *)(local_10 + (ulong)local_603c * 4));
    for (local_6044 = 0; local_6044 < 3; local_6044 = local_6044 + 1) {
      local_6048 = local_6044 * 0xb;
      aiStack_6058[3] = local_6040 >> ((byte)(local_6044 * 0xb) & 0x1f) & 0x7ff;
      local_6038[(ulong)local_6044 * 0x800 + (ulong)(uint)aiStack_6058[3]] =
           local_6038[(ulong)local_6044 * 0x800 + (ulong)(uint)aiStack_6058[3]] + 1;
    }
  }
  for (local_605c = 0; local_605c < 3; local_605c = local_605c + 1) {
    aiStack_6058[local_605c] = local_6038[(ulong)local_605c * 0x800];
    local_6038[(ulong)local_605c * 0x800] = 0;
  }
  for (local_6064 = 1; local_6064 < 0x800; local_6064 = local_6064 + 1) {
    for (local_6068 = 0; local_6068 < 3; local_6068 = local_6068 + 1) {
      iVar1 = local_6038[(ulong)local_6068 * 0x800 + (ulong)local_6064];
      iVar2 = aiStack_6058[local_6068];
      local_6060 = iVar1 + iVar2;
      local_6038[(ulong)local_6068 * 0x800 + (ulong)local_6064] = aiStack_6058[local_6068];
      aiStack_6058[local_6068] = iVar1 + iVar2;
    }
  }
  local_6088[2] = local_10;
  local_6088[3] = local_18;
  local_6088[0] = local_20;
  local_6088[1] = local_28;
  RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (local_10,local_18,local_20,local_28,local_2c,local_6038,0);
  for (local_609c = 1; local_609c < 2; local_609c = local_609c + 1) {
    uVar3 = local_609c & 1;
    uVar4 = (uint)((uVar3 != 0 ^ 0xffU) & 1);
    RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
    radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
              (local_6088[(ulong)uVar3 + 2],local_6088[(ulong)uVar4 + 2],local_6088[uVar3],
               local_6088[uVar4],local_2c,local_6038 + (ulong)local_609c * 0x800,local_609c * 0xb);
  }
  RadixSort<11u,unsigned_int,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (local_6088[2],local_6088[3],local_6088[0],local_6088[1],local_2c,auStack_2038,0x16);
  return 1;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }